

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u8 minMaxQuery(sqlite3 *db,Expr *pFunc,ExprList **ppMinMax)

{
  char *zLeft;
  int iVar1;
  ExprList *pEVar2;
  u8 uVar3;
  u8 uVar4;
  
  pEVar2 = (pFunc->x).pList;
  if ((pEVar2 == (ExprList *)0x0) || (pEVar2->nExpr != 1)) {
LAB_0017cecc:
    uVar3 = '\0';
  }
  else {
    zLeft = (pFunc->u).zToken;
    iVar1 = sqlite3StrICmp(zLeft,"min");
    if (iVar1 == 0) {
      uVar3 = '\x01';
      uVar4 = '\0';
    }
    else {
      iVar1 = sqlite3StrICmp(zLeft,"max");
      if (iVar1 != 0) goto LAB_0017cecc;
      uVar4 = '\x01';
      uVar3 = '\x02';
    }
    pEVar2 = sqlite3ExprListDup(db,pEVar2,0);
    *ppMinMax = pEVar2;
    if (pEVar2 != (ExprList *)0x0) {
      pEVar2->a[0].sortOrder = uVar4;
    }
  }
  return uVar3;
}

Assistant:

static u8 minMaxQuery(sqlite3 *db, Expr *pFunc, ExprList **ppMinMax){
  int eRet = WHERE_ORDERBY_NORMAL;      /* Return value */
  ExprList *pEList = pFunc->x.pList;    /* Arguments to agg function */
  const char *zFunc;                    /* Name of aggregate function pFunc */
  ExprList *pOrderBy;
  u8 sortOrder;

  assert( *ppMinMax==0 );
  assert( pFunc->op==TK_AGG_FUNCTION );
  if( pEList==0 || pEList->nExpr!=1 ) return eRet;
  zFunc = pFunc->u.zToken;
  if( sqlite3StrICmp(zFunc, "min")==0 ){
    eRet = WHERE_ORDERBY_MIN;
    sortOrder = SQLITE_SO_ASC;
  }else if( sqlite3StrICmp(zFunc, "max")==0 ){
    eRet = WHERE_ORDERBY_MAX;
    sortOrder = SQLITE_SO_DESC;
  }else{
    return eRet;
  }
  *ppMinMax = pOrderBy = sqlite3ExprListDup(db, pEList, 0);
  assert( pOrderBy!=0 || db->mallocFailed );
  if( pOrderBy ) pOrderBy->a[0].sortOrder = sortOrder;
  return eRet;
}